

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O3

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  char zero [256];
  undefined1 auStack_320 [512];
  undefined8 uStack_120;
  undefined1 auStack_118 [256];
  
  uStack_120._0_4_ = 0x16649b;
  uStack_120._4_4_ = 0;
  memset(auStack_118,0,0x100);
  iVar2 = random_cb_called;
  if (status == 0) {
    if ((char *)buf != scratch) goto LAB_00166511;
    if (random_cb_called != 0) {
      if (buflen == 0x100) {
        uStack_120._0_4_ = 0x1664d2;
        uStack_120._4_4_ = 0;
        iVar1 = bcmp(scratch,auStack_118,0x100);
        if (iVar1 != 0) goto LAB_001664f8;
        uStack_120._0_4_ = 0x1664db;
        uStack_120._4_4_ = 0;
        random_cb_cold_4();
        goto LAB_001664db;
      }
      goto LAB_00166516;
    }
LAB_001664db:
    if (buflen != 0) goto LAB_0016651b;
    uStack_120._0_4_ = 0x1664f4;
    uStack_120._4_4_ = 0;
    iVar1 = bcmp(scratch,auStack_118,0x100);
    if (iVar1 == 0) {
LAB_001664f8:
      random_cb_called = iVar2 + 1;
      return;
    }
  }
  else {
    uStack_120._0_4_ = 0x166511;
    uStack_120._4_4_ = 0;
    random_cb_cold_1();
LAB_00166511:
    uStack_120._0_4_ = 0x166516;
    uStack_120._4_4_ = 0;
    random_cb_cold_2();
LAB_00166516:
    uStack_120._0_4_ = 0x16651b;
    uStack_120._4_4_ = 0;
    random_cb_cold_3();
LAB_0016651b:
    uStack_120._0_4_ = 0x166520;
    uStack_120._4_4_ = 0;
    random_cb_cold_5();
  }
  uStack_120 = run_test_random_sync;
  random_cb_cold_6();
  loop = (uv_loop_t *)auStack_320;
  puVar3 = (uv_loop_t *)0x0;
  uStack_120 = (code *)buflen;
  iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_320,0x100,0xffffffff,
                    (uv_random_cb)0x0);
  if (iVar2 == -0x16) {
    puVar3 = (uv_loop_t *)0x0;
    iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_320,0xffffffffffffffff,0xffffffff,
                      (uv_random_cb)0x0);
    if (iVar2 != -7) goto LAB_00166611;
    memset(auStack_320,0,0x100);
    puVar3 = (uv_loop_t *)0x0;
    iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_320,0x100,0,(uv_random_cb)0x0);
    if (iVar2 != 0) goto LAB_00166616;
    memset(auStack_320 + 0x100,0,0x100);
    iVar2 = bcmp(auStack_320,auStack_320 + 0x100,0x100);
    if (iVar2 != 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar2 = uv_loop_close(loop);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00166620;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_00166611:
    run_test_random_sync_cold_2();
LAB_00166616:
    loop = puVar3;
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_00166620:
  run_test_random_sync_cold_4();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT(0 == status);
  ASSERT(buf == (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT(buflen == 0);
    ASSERT(0 == memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT(buflen == sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT(0 != memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}